

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  SRes SVar5;
  uint uVar6;
  
  SVar5 = 4;
  if (4 < propsSize) {
    uVar6 = 0x1000;
    if (0x1000 < *(uint *)(props + 1)) {
      uVar6 = *(uint *)(props + 1);
    }
    bVar1 = *props;
    if (bVar1 < 0xe1) {
      uVar4 = bVar1 / 9;
      cVar3 = (char)uVar4;
      bVar2 = cVar3 + (char)(uVar4 * 0x34 >> 8) * -5;
      uVar4 = (uint)(byte)(bVar1 + cVar3 * -9);
      SVar5 = LzmaDec_AllocateProbs2(p,(CLzmaProps *)(ulong)uVar4,(ISzAlloc *)(ulong)bVar2);
      if (SVar5 == 0) {
        cVar3 = (char)((uint)bVar1 * 0x6d >> 8);
        (p->prop).lc = uVar4;
        (p->prop).lp = (uint)bVar2;
        (p->prop).pb = (uint)((byte)(((byte)(bVar1 - cVar3) >> 1) + cVar3) >> 5);
        (p->prop).dicSize = uVar6;
        SVar5 = 0;
      }
    }
  }
  return SVar5;
}

Assistant:

SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}